

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlChar * xmlEncodeEntitiesInternal(xmlDocPtr doc,xmlChar *input,uint flags)

{
  uint local_24;
  uint flags_local;
  xmlChar *input_local;
  xmlDocPtr doc_local;
  
  if (input == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    if ((doc == (xmlDocPtr)0x0) || (doc->type != XML_HTML_DOCUMENT_NODE)) {
      if ((doc == (xmlDocPtr)0x0) || (local_24 = flags, doc->encoding == (xmlChar *)0x0)) {
        local_24 = flags | 2;
      }
    }
    else {
      local_24 = flags | 4;
    }
    doc_local = (xmlDocPtr)xmlEscapeText(input,local_24);
  }
  return (xmlChar *)doc_local;
}

Assistant:

xmlChar *
xmlEncodeEntitiesInternal(xmlDocPtr doc, const xmlChar *input,
                          unsigned flags) {
    if (input == NULL)
        return(NULL);

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE))
        flags |= XML_ESCAPE_HTML;
    else if ((doc == NULL) || (doc->encoding == NULL))
        flags |= XML_ESCAPE_NON_ASCII;

    return(xmlEscapeText(input, flags));
}